

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O3

void __thiscall
FunctionData::FunctionData
          (FunctionData *this,Allocator *allocator,SynBase *source,ScopeData *scope,bool coroutine,
          bool accessor,bool isOperator,TypeFunction *type,TypeBase *contextType,SynIdentifier *name
          ,IntrusiveList<MatchData> generics,uint uniqueId)

{
  Node *dst;
  InplaceStr *pIVar1;
  Node *dst_00;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  
  this->source = source;
  this->scope = scope;
  this->coroutine = coroutine;
  this->accessor = accessor;
  this->isOperator = isOperator;
  this->type = type;
  this->contextType = contextType;
  this->name = name;
  (this->generics).head = generics.head;
  (this->generics).tail = generics.tail;
  this->uniqueId = uniqueId;
  (this->aliases).head = (MatchData *)0x0;
  (this->aliases).tail = (MatchData *)0x0;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&(this->arguments).little[0].source + lVar4) = 0;
    (&(this->arguments).little[0].isExplicit)[lVar4] = false;
    puVar2 = (undefined8 *)((long)&(this->arguments).little[0].name + lVar4);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)&(this->arguments).little[0].value + lVar4);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0xc0);
  (this->arguments).allocator = allocator;
  (this->arguments).data = (this->arguments).little;
  (this->arguments).count = 0;
  (this->arguments).max = 4;
  (this->instances).allocator = allocator;
  (this->instances).data = (this->instances).little;
  (this->instances).count = 0;
  (this->instances).max = 8;
  (this->argumentVariables).head = (VariableHandle *)0x0;
  (this->argumentVariables).tail = (VariableHandle *)0x0;
  (this->upvalues).head = (UpvalueData *)0x0;
  (this->upvalues).tail = (UpvalueData *)0x0;
  (this->upvalueVariableMap).allocator = allocator;
  (this->upvalueVariableMap).bucketCount = 2;
  (this->upvalueVariableMap).count = 0;
  dst = (this->upvalueVariableMap).storage;
  (this->upvalueVariableMap).data = dst;
  NULLC::fillMemory(dst,0,0x20);
  pIVar1 = (this->upvalueNameSet).storage;
  (this->upvalueNameSet).storage[1].begin = (char *)0x0;
  (this->upvalueNameSet).storage[1].end = (char *)0x0;
  (this->upvalueNameSet).storage[0].begin = (char *)0x0;
  (this->upvalueNameSet).storage[0].end = (char *)0x0;
  (this->upvalueNameSet).allocator = allocator;
  (this->upvalueNameSet).bucketCount = 2;
  (this->upvalueNameSet).count = 0;
  (this->upvalueNameSet).data = pIVar1;
  NULLC::fillMemory(pIVar1,0,0x20);
  (this->coroutineState).head = (CoroutineStateData *)0x0;
  (this->coroutineState).tail = (CoroutineStateData *)0x0;
  (this->coroutineStateVariableMap).allocator = allocator;
  (this->coroutineStateVariableMap).bucketCount = 2;
  (this->coroutineStateVariableMap).count = 0;
  dst_00 = (this->coroutineStateVariableMap).storage;
  (this->coroutineStateVariableMap).data = dst_00;
  NULLC::fillMemory(dst_00,0,0x20);
  pIVar1 = (this->coroutineStateNameSet).storage;
  (this->coroutineStateNameSet).storage[1].begin = (char *)0x0;
  (this->coroutineStateNameSet).storage[1].end = (char *)0x0;
  (this->coroutineStateNameSet).storage[0].begin = (char *)0x0;
  (this->coroutineStateNameSet).storage[0].end = (char *)0x0;
  (this->coroutineStateNameSet).allocator = allocator;
  (this->coroutineStateNameSet).bucketCount = 2;
  (this->coroutineStateNameSet).count = 0;
  (this->coroutineStateNameSet).data = pIVar1;
  NULLC::fillMemory(pIVar1,0,0x20);
  (this->closeUpvalues).head = (CloseUpvaluesData *)0x0;
  (this->closeUpvalues).tail = (CloseUpvaluesData *)0x0;
  this->importModule = (ModuleData *)0x0;
  this->isInternal = false;
  this->isHidden = false;
  this->attributes = 0;
  uVar3 = NULLC::GetStringHash((name->name).begin,(name->name).end);
  this->nameHash = uVar3;
  this->functionIndex = 0xffffffff;
  this->isPrototype = false;
  this->yieldCount = 0;
  this->hasExplicitReturn = false;
  this->vmFunction = (VmFunction *)0x0;
  this->nextTranslateRestoreBlock = 0;
  this->implementation = (FunctionData *)0x0;
  this->proto = (FunctionData *)0x0;
  this->isGenericInstance = false;
  this->definition = (SynFunctionDefinition *)0x0;
  this->delayedDefinition = (Lexeme *)0x0;
  this->declaration = (ExprBase *)0x0;
  this->functionScope = (ScopeData *)0x0;
  this->argumentsSize = 0;
  this->stackSize = 0;
  this->contextArgument = (VariableData *)0x0;
  this->coroutineJumpOffset = (VariableData *)0x0;
  return;
}

Assistant:

FunctionData(Allocator *allocator, SynBase *source, ScopeData *scope, bool coroutine, bool accessor, bool isOperator, TypeFunction *type, TypeBase *contextType, SynIdentifier *name, IntrusiveList<MatchData> generics, unsigned uniqueId): source(source), scope(scope), coroutine(coroutine), accessor(accessor), isOperator(isOperator), type(type), contextType(contextType), name(name), generics(generics), uniqueId(uniqueId), arguments(allocator), instances(allocator), upvalueVariableMap(allocator), upvalueNameSet(allocator), coroutineStateVariableMap(allocator), coroutineStateNameSet(allocator)
	{
		importModule = 0;

		isInternal = false;

		isHidden = false;

		attributes = 0;

		nameHash = name->name.hash();

		functionIndex = ~0u;

		isPrototype = false;
		implementation = NULL;

		proto = NULL;
		isGenericInstance = false;

		definition = NULL;
		delayedDefinition = NULL;

		declaration = NULL;

		functionScope = NULL;
		argumentsSize = 0;
		stackSize = 0;

		contextArgument = NULL;

		coroutineJumpOffset = NULL;

		yieldCount = 0;

		hasExplicitReturn = false;

		vmFunction = NULL;

		nextTranslateRestoreBlock = 0;
	}